

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Config_testDefaultSamplingServerURL_Test::TestBody
          (Config_testDefaultSamplingServerURL_Test *this)

{
  bool bVar1;
  Config *this_00;
  string *rhs;
  char *pcVar2;
  AssertHelper local_468 [8];
  Message local_460 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_458;
  allocator local_431;
  string local_430;
  duration local_410;
  allocator local_401;
  string local_400;
  RestrictionsConfig local_3e0;
  HeadersConfig local_3b0;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  duration local_2e0;
  Config local_2d8;
  duration local_280;
  allocator local_271;
  string local_270;
  allocator local_239;
  string local_238;
  Config local_218;
  Config local_1c0;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Config_testDefaultSamplingServerURL_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"remote",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"http://127.0.0.1:5778/sampling",&local_271);
  local_280 = samplers::Config::defaultSamplingRefreshInterval();
  samplers::Config::Config(&local_218,&local_238,0.001,&local_270,2000,&local_280);
  local_2e0 = reporters::Config::defaultBufferFlushInterval();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"127.0.0.1:6831",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"",&local_329);
  reporters::Config::Config(&local_2d8,100,&local_2e0,false,&local_300,&local_328);
  propagation::HeadersConfig::HeadersConfig(&local_3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,"",&local_401);
  local_410.__r = 0;
  baggage::RestrictionsConfig::RestrictionsConfig(&local_3e0,false,&local_400,&local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"",&local_431);
  local_458.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_458);
  Config::Config(&local_1c0,false,&local_218,&local_2d8,&local_3b0,&local_3e0,&local_430,&local_458)
  ;
  this_00 = Config::sampler(&local_1c0);
  rhs = samplers::Config::samplingServerURL_abi_cxx11_(this_00);
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"http://127.0.0.1:5778/sampling\"",
             "Config().sampler().samplingServerURL()",
             (char (*) [31])"http://127.0.0.1:5778/sampling",rhs);
  Config::~Config(&local_1c0);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_458);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  baggage::RestrictionsConfig::~RestrictionsConfig(&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  propagation::HeadersConfig::~HeadersConfig(&local_3b0);
  reporters::Config::~Config(&local_2d8);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  samplers::Config::~Config(&local_218);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_468,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(local_468,local_460);
    testing::internal::AssertHelper::~AssertHelper(local_468);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(Config, testDefaultSamplingServerURL)
{
    ASSERT_EQ("http://127.0.0.1:5778/sampling",
              Config().sampler().samplingServerURL());
}